

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receptacle.cpp
# Opt level: O2

bool __thiscall
Refal2::CReceptacle::find
          (CReceptacle *this,CUnitNode *key,CUnitNode **leftBorderNode,CUnitNode **equalNode)

{
  TUnitType TVar1;
  CUnitNode *pCVar2;
  bool bVar3;
  int iVar4;
  CNode<Refal2::CUnit> **ppCVar5;
  CUnitNode *unit;
  CNode<Refal2::CUnit> *this_00;
  
  ppCVar5 = &(this->data).super_CNodeList<Refal2::CUnit>.first;
  do {
    pCVar2 = *ppCVar5;
    *leftBorderNode = pCVar2;
    if (pCVar2 == (CUnitNode *)0x0) {
      unit = (CUnitNode *)0x0;
LAB_00133357:
      *equalNode = unit;
      return pCVar2 != (CUnitNode *)0x0;
    }
    if (((pCVar2->super_CUnit).type & UT_LeftParen) == 0) {
      __assert_fail("leftBorderNode->IsLeftParen()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Receptacle.cpp"
                    ,0x76,
                    "bool Refal2::CReceptacle::find(const CUnitNode *, CUnitNode *&, CUnitNode *&)")
      ;
    }
    iVar4 = 0;
    unit = pCVar2;
    for (this_00 = key; unit = unit->next, this_00 != (CUnitNode *)0x0; this_00 = this_00->next) {
      bVar3 = CUnit::IsEqualWith(&this_00->super_CUnit,&unit->super_CUnit);
      if (!bVar3) {
        if (((this_00->super_CUnit).type & UT_Char) == 0) goto LAB_0013333e;
LAB_00133328:
        if ((this_00->super_CUnit).field_1.c != '=') goto LAB_0013333e;
        break;
      }
      TVar1 = (this_00->super_CUnit).type;
      if (((iVar4 < 1) && ((TVar1 & UT_Char) != 0)) && ((this_00->super_CUnit).field_1.c == '='))
      goto LAB_00133328;
      if ((TVar1 & UT_LeftParen) == 0) {
        if ((TVar1 & UT_RightParen) != 0) {
          if (iVar4 < 1) {
            __assert_fail("depth > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Receptacle.cpp"
                          ,0x80,
                          "bool Refal2::CReceptacle::find(const CUnitNode *, CUnitNode *&, CUnitNode *&)"
                         );
          }
          iVar4 = iVar4 + -1;
        }
      }
      else {
        iVar4 = iVar4 + 1;
      }
    }
    if ((((unit->super_CUnit).type & UT_Char) != 0) && ((unit->super_CUnit).field_1.c == '=')) {
      if (iVar4 != 0) {
        __assert_fail("depth == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Receptacle.cpp"
                      ,0x89,
                      "bool Refal2::CReceptacle::find(const CUnitNode *, CUnitNode *&, CUnitNode *&)"
                     );
      }
      goto LAB_00133357;
    }
LAB_0013333e:
    ppCVar5 = &(((*leftBorderNode)->super_CUnit).field_1.pairedParen)->next;
  } while( true );
}

Assistant:

bool CReceptacle::find( const CUnitNode* key,
	CUnitNode*& leftBorderNode, CUnitNode*& equalNode )
{
	leftBorderNode = data.GetFirst();
	while( leftBorderNode != nullptr ) {
		assert( leftBorderNode->IsLeftParen() );
		const CUnitNode* keyNode = key;
		CUnitNode* burriedKeyNode = leftBorderNode->Next();
		int depth = 0;
		while( keyNode != nullptr && keyNode->IsEqualWith( *burriedKeyNode )
			&& ( depth > 0 || !isEqualNode( keyNode ) ) )
		{
			if( keyNode->IsLeftParen() ) {
				depth++;
			} else if( keyNode->IsRightParen() ) {
				assert( depth > 0 );
				depth--;
			}
			keyNode = keyNode->Next();
			burriedKeyNode = burriedKeyNode->Next();
		}
		if( ( keyNode == nullptr || isEqualNode( keyNode ) )
			&& isEqualNode( burriedKeyNode ) )
		{
			assert( depth == 0 );
			equalNode = burriedKeyNode;
			return true;
		}
		leftBorderNode = leftBorderNode->PairedParen()->Next();
	}
	equalNode = nullptr;
	return false;
}